

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgkyujj(fitsfile *fptr,char *keyname,ULONGLONG *value,char *comm,int *status)

{
  char valstring [71];
  char acStack_68 [80];
  
  if (0 < *status) {
    return *status;
  }
  ffgkey(fptr,keyname,acStack_68,comm,status);
  ffc2uj(acStack_68,value,status);
  return *status;
}

Assistant:

int ffgkyujj( fitsfile *fptr,     /* I - FITS file pointer         */
            const char *keyname,      /* I - name of keyword to read   */
            ULONGLONG *value,    /* O - keyword value             */
            char *comm,         /* O - keyword comment           */
            int  *status)       /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The value will be implicitly converted to a (ULONGLONG) integer if it not
  already of this datatype.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */
    ffc2uj(valstring, value, status);   /* convert string to value */

    return(*status);
}